

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysp_when ** lysp_node_when_p(lysp_node *node)

{
  uint16_t uVar1;
  lysp_node *node_local;
  
  if (node == (lysp_node *)0x0) {
    node_local = (lysp_node *)0x0;
  }
  else {
    uVar1 = node->nodetype;
    if (uVar1 == 1) {
      node_local = (lysp_node *)&node[1].nodetype;
    }
    else if (uVar1 == 2) {
      node_local = (lysp_node *)&node[1].nodetype;
    }
    else if (uVar1 == 4) {
      node_local = (lysp_node *)&node[1].nodetype;
    }
    else if (uVar1 == 8) {
      node_local = (lysp_node *)&node[1].nodetype;
    }
    else if (uVar1 == 0x10) {
      node_local = (lysp_node *)&node[1].nodetype;
    }
    else if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
      node_local = (lysp_node *)&node[1].nodetype;
    }
    else if (uVar1 == 0x80) {
      node_local = (lysp_node *)&node[1].nodetype;
    }
    else if (uVar1 == 0x800) {
      node_local = (lysp_node *)&node[1].next;
    }
    else if (uVar1 == 0x8000) {
      node_local = (lysp_node *)&node[1].nodetype;
    }
    else {
      node_local = (lysp_node *)0x0;
    }
  }
  return (lysp_when **)node_local;
}

Assistant:

struct lysp_when **
lysp_node_when_p(const struct lysp_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysp_node_container *)node)->when;
    case LYS_CHOICE:
        return &((struct lysp_node_choice *)node)->when;
    case LYS_LEAF:
        return &((struct lysp_node_leaf *)node)->when;
    case LYS_LEAFLIST:
        return &((struct lysp_node_leaflist *)node)->when;
    case LYS_LIST:
        return &((struct lysp_node_list *)node)->when;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysp_node_anydata *)node)->when;
    case LYS_CASE:
        return &((struct lysp_node_case *)node)->when;
    case LYS_USES:
        return &((struct lysp_node_uses *)node)->when;
    case LYS_AUGMENT:
        return &((struct lysp_node_augment *)node)->when;
    default:
        return NULL;
    }
}